

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenSelect(BinaryenModuleRef module,BinaryenExpressionRef condition,BinaryenExpressionRef ifTrue
              ,BinaryenExpressionRef ifFalse)

{
  Select *this;
  
  this = (Select *)MixedArena::allocSpace(&module->allocator,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression._id = SelectId;
  (this->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id = 0;
  this->condition = condition;
  this->ifTrue = ifTrue;
  this->ifFalse = ifFalse;
  wasm::Select::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenSelect(BinaryenModuleRef module,
                                     BinaryenExpressionRef condition,
                                     BinaryenExpressionRef ifTrue,
                                     BinaryenExpressionRef ifFalse) {
  auto* ret = ((Module*)module)->allocator.alloc<Select>();
  ret->condition = (Expression*)condition;
  ret->ifTrue = (Expression*)ifTrue;
  ret->ifFalse = (Expression*)ifFalse;
  ret->finalize();
  return static_cast<Expression*>(ret);
}